

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O2

qsizetype __thiscall
QStringView::indexOf(QStringView *this,QChar c,qsizetype from,CaseSensitivity cs)

{
  qsizetype qVar1;
  undefined6 in_register_00000032;
  CaseSensitivity in_R9D;
  QStringView str;
  
  str.m_data = (storage_type_conflict *)from;
  str.m_size = (qsizetype)this->m_data;
  qVar1 = QtPrivate::findString
                    ((QtPrivate *)this->m_size,str,CONCAT62(in_register_00000032,c.ucs) & 0xffffffff
                     ,(QChar)(char16_t)cs,in_R9D);
  return qVar1;
}

Assistant:

[[nodiscard]] qsizetype indexOf(QChar c, qsizetype from = 0, Qt::CaseSensitivity cs = Qt::CaseSensitive) const noexcept
    { return QtPrivate::findString(*this, from, c.unicode(), cs); }